

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall AActor::SetOrigin(AActor *this,double x,double y,double z,bool moving)

{
  double dVar1;
  undefined7 in_register_00000031;
  int iVar2;
  FLinkContext ctx;
  FLinkContext local_38;
  
  local_38.sector_list = (msecnode_t *)0x0;
  local_38.render_list = (msecnode_t *)0x0;
  UnlinkFromWorld(this,&local_38);
  (this->__Pos).Z = z;
  (this->__Pos).Y = y;
  (this->__Pos).X = x;
  iVar2 = 0;
  LinkToWorld(this,&local_38,false,(sector_t *)0x0);
  P_FindFloorCeiling(this,1);
  if ((int)CONCAT71(in_register_00000031,moving) == 0) {
    (this->Prev).Z = (this->__Pos).Z;
    dVar1 = (this->__Pos).Y;
    (this->Prev).X = (this->__Pos).X;
    (this->Prev).Y = dVar1;
    (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
    dVar1 = (this->Angles).Yaw.Degrees;
    (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
    (this->PrevAngles).Yaw.Degrees = dVar1;
    if (this->Sector != (sector_t *)0x0) {
      iVar2 = this->Sector->PortalGroup;
    }
    this->PrevPortalGroup = iVar2;
  }
  return;
}

Assistant:

void AActor::SetOrigin(double x, double y, double z, bool moving)
{
	FLinkContext ctx;
	UnlinkFromWorld (&ctx);
	SetXYZ(x, y, z);
	LinkToWorld (&ctx);
	P_FindFloorCeiling(this, FFCF_ONLYSPAWNPOS);
	if (!moving) ClearInterpolation();
}